

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O0

ktx_error_code_e ktxFileStream_getsize(ktxStream *str,ktx_size_t *size)

{
  int iVar1;
  int *piVar2;
  __off_t *in_RSI;
  long in_RDI;
  mode_t ftype;
  int statret;
  stat statbuf;
  stat local_a8;
  __off_t *local_18;
  long local_10;
  ktx_error_code_e local_4;
  
  if ((in_RDI == 0) || (in_RSI == (__off_t *)0x0)) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    if (*(int *)(in_RDI + 0x38) != 1) {
      __assert_fail("str->type == eStreamTypeFile",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/filestream.c"
                    ,0x134,"ktx_error_code_e ktxFileStream_getsize(ktxStream *, ktx_size_t *)");
    }
    local_18 = in_RSI;
    local_10 = in_RDI;
    fflush(*(FILE **)(in_RDI + 0x40));
    iVar1 = fileno(*(FILE **)(local_10 + 0x40));
    iVar1 = fstat(iVar1,&local_a8);
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      if ((*piVar2 == 5) || (*piVar2 != 0x4b)) {
        local_4 = KTX_FILE_READ_ERROR;
      }
      else {
        local_4 = KTX_FILE_OVERFLOW;
      }
    }
    else if (((local_a8.st_mode & 0xf000) == 0x1000) || ((local_a8.st_mode & 0xf000) == 0xc000)) {
      local_4 = KTX_FILE_ISPIPE;
    }
    else if ((local_a8.st_mode & 0x2000) == 0) {
      *local_18 = local_a8.st_size;
      local_4 = KTX_SUCCESS;
    }
    else {
      local_4 = KTX_INVALID_OPERATION;
    }
  }
  return local_4;
}

Assistant:

static
KTX_error_code ktxFileStream_getsize(ktxStream* str, ktx_size_t* size)
{
    struct stat statbuf;
    int statret;

    if (!str || !size)
        return KTX_INVALID_VALUE;

    assert(str->type == eStreamTypeFile);

    // Need to flush so that fstat will return the current size.
    // Can ignore return value. The only error that can happen is to tell you
    // it was a NOP because the file is read only.
#if (defined(_MSC_VER) && _MSC_VER < 1900) || defined(__MINGW64__) && !defined(_UCRT)
    // Bug in VS2013 msvcrt. fflush on FILE open for READ changes file offset
    // to 4096.
    if (str->data.file->_flag & _IOWRT)
        (void)fflush(str->data.file);
#else
    (void)fflush(str->data.file);
#endif
    statret = fstat(fileno(str->data.file), &statbuf);
    if (statret < 0) {
        switch (errno) {
          case EOVERFLOW: return KTX_FILE_OVERFLOW;
          case EIO:
          default:
            return KTX_FILE_READ_ERROR;
        }
    }

    mode_t ftype = statbuf.st_mode & S_IFMT;
    if (ftype == S_IFIFO || ftype == S_IFSOCK)
        return KTX_FILE_ISPIPE;

    if (statbuf.st_mode & S_IFCHR)
        return KTX_INVALID_OPERATION;

    *size = (ktx_size_t)statbuf.st_size; /* See _getpos for why this cast. */

    return KTX_SUCCESS;
}